

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ELU_x86_avx512::forward_inplace(ELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 (*pauVar10) [64];
  long lVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar12 [16];
  undefined1 auVar22 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 extraout_var [60];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float afVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float afVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_ZMM20 [64];
  undefined1 auVar53 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar54 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar28 [32];
  undefined1 auVar20 [16];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    auVar29 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar30 = vxorps_avx512dq(auVar29,(undefined1  [64])::_ps512_cephes_exp_C1);
    auVar29 = vxorps_avx512dq(auVar29,(undefined1  [64])::_ps512_cephes_exp_C2);
    lVar11 = 0;
    auVar12 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
    auVar53 = ZEXT1664(auVar12);
    auVar12 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
    auVar54 = ZEXT1664(auVar12);
    auVar22 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar55 = ZEXT3264(auVar22);
    auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar56 = ZEXT3264(auVar22);
    auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar57 = ZEXT3264(auVar22);
    auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar59 = ZEXT3264(auVar22);
    auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar60 = ZEXT3264(auVar22);
    auVar22 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar61 = ZEXT3264(auVar22);
    auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar62 = ZEXT3264(auVar22);
    auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar63 = ZEXT3264(auVar22);
    afVar40 = ::_ps512_1;
    afVar49 = ::_ps512_cephes_exp_p5;
    do {
      pauVar10 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar9 < 0x10) {
        uVar7 = 0;
      }
      else {
        auVar31 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_ELU).alpha));
        iVar5 = 0xf;
        do {
          auVar32 = vmaxps_avx512f(*pauVar10,auVar53);
          auVar33 = vminps_avx512f(*pauVar10,auVar53);
          auVar33 = vminps_avx512f(auVar33,(undefined1  [64])::_ps512_exp_hi);
          auVar33 = vmaxps_avx512f(auVar33,(undefined1  [64])::_ps512_exp_lo);
          auVar34 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar33,
                                        (undefined1  [64])afVar49);
          auVar35 = vrndscaleps_avx512f(auVar34,1);
          uVar4 = vcmpps_avx512f(auVar34,auVar35,1);
          auVar34 = vsubps_avx512f(auVar35,(undefined1  [64])afVar40);
          bVar3 = (bool)((byte)uVar4 & 1);
          auVar36._0_4_ = (uint)bVar3 * auVar34._0_4_ | (uint)!bVar3 * auVar35._0_4_;
          bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
          auVar36._4_4_ = (uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * auVar35._4_4_;
          bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
          auVar36._8_4_ = (uint)bVar3 * auVar34._8_4_ | (uint)!bVar3 * auVar35._8_4_;
          bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
          auVar36._12_4_ = (uint)bVar3 * auVar34._12_4_ | (uint)!bVar3 * auVar35._12_4_;
          bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
          auVar36._16_4_ = (uint)bVar3 * auVar34._16_4_ | (uint)!bVar3 * auVar35._16_4_;
          bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
          auVar36._20_4_ = (uint)bVar3 * auVar34._20_4_ | (uint)!bVar3 * auVar35._20_4_;
          bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
          auVar36._24_4_ = (uint)bVar3 * auVar34._24_4_ | (uint)!bVar3 * auVar35._24_4_;
          bVar3 = (bool)((byte)(uVar4 >> 7) & 1);
          auVar36._28_4_ = (uint)bVar3 * auVar34._28_4_ | (uint)!bVar3 * auVar35._28_4_;
          bVar3 = (bool)((byte)(uVar4 >> 8) & 1);
          auVar36._32_4_ = (uint)bVar3 * auVar34._32_4_ | (uint)!bVar3 * auVar35._32_4_;
          bVar3 = (bool)((byte)(uVar4 >> 9) & 1);
          auVar36._36_4_ = (uint)bVar3 * auVar34._36_4_ | (uint)!bVar3 * auVar35._36_4_;
          bVar3 = (bool)((byte)(uVar4 >> 10) & 1);
          auVar36._40_4_ = (uint)bVar3 * auVar34._40_4_ | (uint)!bVar3 * auVar35._40_4_;
          bVar3 = (bool)((byte)(uVar4 >> 0xb) & 1);
          auVar36._44_4_ = (uint)bVar3 * auVar34._44_4_ | (uint)!bVar3 * auVar35._44_4_;
          bVar3 = (bool)((byte)(uVar4 >> 0xc) & 1);
          auVar36._48_4_ = (uint)bVar3 * auVar34._48_4_ | (uint)!bVar3 * auVar35._48_4_;
          bVar3 = (bool)((byte)(uVar4 >> 0xd) & 1);
          auVar36._52_4_ = (uint)bVar3 * auVar34._52_4_ | (uint)!bVar3 * auVar35._52_4_;
          bVar3 = (bool)((byte)(uVar4 >> 0xe) & 1);
          auVar36._56_4_ = (uint)bVar3 * auVar34._56_4_ | (uint)!bVar3 * auVar35._56_4_;
          bVar3 = SUB81(uVar4 >> 0xf,0);
          auVar36._60_4_ = (uint)bVar3 * auVar34._60_4_ | (uint)!bVar3 * auVar35._60_4_;
          auVar33 = vfmadd231ps_avx512f(auVar33,auVar36,auVar30);
          auVar33 = vfmadd231ps_avx512f(auVar33,auVar36,auVar29);
          auVar34 = vmulps_avx512f(auVar33,auVar33);
          auVar35 = vfmadd132ps_avx512f(auVar33,(undefined1  [64])::_ps512_cephes_exp_p1,
                                        (undefined1  [64])::_ps512_cephes_exp_p0);
          auVar35 = vfmadd213ps_avx512f(auVar35,auVar33,(undefined1  [64])::_ps512_cephes_exp_p2);
          auVar35 = vfmadd213ps_avx512f(auVar35,auVar33,(undefined1  [64])::_ps512_cephes_exp_p3);
          auVar35 = vfmadd213ps_avx512f(auVar35,auVar33,(undefined1  [64])::_ps512_cephes_exp_p4);
          auVar35 = vfmadd213ps_avx512f(auVar35,auVar33,(undefined1  [64])afVar49);
          auVar33 = vfmadd213ps_avx512f(auVar35,auVar34,auVar33);
          auVar34 = vaddps_avx512f(auVar33,(undefined1  [64])afVar40);
          auVar33 = vcvttps2dq_avx512f(auVar36);
          auVar33 = vpaddd_avx512f(auVar33,(undefined1  [64])::_pi32_512_0x7f);
          auVar35 = vpslld_avx512f(auVar33,0x17);
          auVar33._8_4_ = 0xbf800000;
          auVar33._0_8_ = 0xbf800000bf800000;
          auVar33._12_4_ = 0xbf800000;
          auVar33._16_4_ = 0xbf800000;
          auVar33._20_4_ = 0xbf800000;
          auVar33._24_4_ = 0xbf800000;
          auVar33._28_4_ = 0xbf800000;
          auVar33._32_4_ = 0xbf800000;
          auVar33._36_4_ = 0xbf800000;
          auVar33._40_4_ = 0xbf800000;
          auVar33._44_4_ = 0xbf800000;
          auVar33._48_4_ = 0xbf800000;
          auVar33._52_4_ = 0xbf800000;
          auVar33._56_4_ = 0xbf800000;
          auVar33._60_4_ = 0xbf800000;
          auVar33 = vfmadd213ps_avx512f(auVar35,auVar34,auVar33);
          auVar33 = vfmadd213ps_avx512f(auVar33,auVar31,auVar32);
          *pauVar10 = auVar33;
          pauVar10 = pauVar10 + 1;
          iVar5 = iVar5 + 0x10;
          uVar7 = uVar9 & 0xfffffff0;
        } while (iVar5 < (int)uVar9);
      }
      if ((int)(uVar7 | 7) < (int)uVar9) {
        fVar1 = (this->super_ELU).alpha;
        auVar22._4_4_ = fVar1;
        auVar22._0_4_ = fVar1;
        auVar22._8_4_ = fVar1;
        auVar22._12_4_ = fVar1;
        auVar22._16_4_ = fVar1;
        auVar22._20_4_ = fVar1;
        auVar22._24_4_ = fVar1;
        auVar22._28_4_ = fVar1;
        auVar42._8_4_ = 0x3d2aa9c1;
        auVar42._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar42._12_4_ = 0x3d2aa9c1;
        auVar42._16_4_ = 0x3d2aa9c1;
        auVar42._20_4_ = 0x3d2aa9c1;
        auVar42._24_4_ = 0x3d2aa9c1;
        auVar42._28_4_ = 0x3d2aa9c1;
        auVar44._8_4_ = 0x3e2aaaaa;
        auVar44._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar44._12_4_ = 0x3e2aaaaa;
        auVar44._16_4_ = 0x3e2aaaaa;
        auVar44._20_4_ = 0x3e2aaaaa;
        auVar44._24_4_ = 0x3e2aaaaa;
        auVar44._28_4_ = 0x3e2aaaaa;
        auVar46._8_4_ = 0x3f800000;
        auVar46._0_8_ = 0x3f8000003f800000;
        auVar46._12_4_ = 0x3f800000;
        auVar46._16_4_ = 0x3f800000;
        auVar46._20_4_ = 0x3f800000;
        auVar46._24_4_ = 0x3f800000;
        auVar46._28_4_ = 0x3f800000;
        uVar6 = uVar7;
        do {
          auVar23 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar10,auVar54._0_32_);
          auVar24 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar10,auVar54._0_32_);
          auVar25._8_4_ = 0x42b0c0a5;
          auVar25._0_8_ = 0x42b0c0a542b0c0a5;
          auVar25._12_4_ = 0x42b0c0a5;
          auVar25._16_4_ = 0x42b0c0a5;
          auVar25._20_4_ = 0x42b0c0a5;
          auVar25._24_4_ = 0x42b0c0a5;
          auVar25._28_4_ = 0x42b0c0a5;
          auVar25 = vminps_avx512vl(auVar24,auVar25);
          auVar24 = vmaxps_avx512vl(auVar25,auVar55._0_32_);
          auVar26 = vfmadd231ps_avx512vl(auVar56._0_32_,auVar24,auVar57._0_32_);
          auVar25 = vroundps_avx(auVar26,1);
          uVar4 = vcmpps_avx512vl(auVar26,auVar25,1);
          auVar58 = auVar59._0_32_;
          auVar27 = vsubps_avx512vl(auVar25,auVar58);
          bVar3 = (bool)((byte)uVar4 & 1);
          auVar28._0_4_ = (float)((uint)bVar3 * auVar27._0_4_ | (uint)!bVar3 * auVar25._0_4_);
          bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
          auVar28._4_4_ = (float)((uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar25._4_4_);
          bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
          auVar28._8_4_ = (float)((uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar25._8_4_);
          bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
          auVar28._12_4_ = (float)((uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar25._12_4_);
          bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
          auVar28._16_4_ = (float)((uint)bVar3 * auVar27._16_4_ | (uint)!bVar3 * auVar25._16_4_);
          bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
          auVar28._20_4_ = (float)((uint)bVar3 * auVar27._20_4_ | (uint)!bVar3 * auVar25._20_4_);
          bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
          auVar28._24_4_ = (float)((uint)bVar3 * auVar27._24_4_ | (uint)!bVar3 * auVar25._24_4_);
          bVar3 = SUB81(uVar4 >> 7,0);
          auVar28._28_4_ = (float)((uint)bVar3 * auVar27._28_4_ | (uint)!bVar3 * auVar25._28_4_);
          auVar25 = vfmsub231ps_avx512vl(auVar24,auVar28,auVar60._0_32_);
          auVar24._8_4_ = 0x395e8083;
          auVar24._0_8_ = 0x395e8083395e8083;
          auVar24._12_4_ = 0x395e8083;
          auVar24._16_4_ = 0x395e8083;
          auVar24._20_4_ = 0x395e8083;
          auVar24._24_4_ = 0x395e8083;
          auVar24._28_4_ = 0x395e8083;
          auVar25 = vfmsub231ps_avx512vl(auVar25,auVar28,auVar24);
          auVar27._4_4_ = auVar25._4_4_ * auVar25._4_4_;
          auVar27._0_4_ = auVar25._0_4_ * auVar25._0_4_;
          auVar27._8_4_ = auVar25._8_4_ * auVar25._8_4_;
          auVar27._12_4_ = auVar25._12_4_ * auVar25._12_4_;
          auVar27._16_4_ = auVar25._16_4_ * auVar25._16_4_;
          auVar27._20_4_ = auVar25._20_4_ * auVar25._20_4_;
          auVar27._24_4_ = auVar25._24_4_ * auVar25._24_4_;
          auVar27._28_4_ = auVar26._28_4_;
          auVar24 = vfmadd213ps_avx512vl(auVar61._0_32_,auVar25,auVar62._0_32_);
          auVar24 = vfmadd213ps_avx512vl(auVar24,auVar25,auVar63._0_32_);
          auVar12 = vfmadd213ps_fma(auVar24,auVar25,auVar42);
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar25,auVar44);
          auVar24 = vfmadd213ps_avx512vl(ZEXT1632(auVar12),auVar25,auVar56._0_32_);
          auVar12 = vfmadd213ps_fma(auVar24,auVar27,auVar25);
          auVar24 = vaddps_avx512vl(ZEXT1632(auVar12),auVar58);
          auVar26._0_4_ = (int)auVar28._0_4_;
          auVar26._4_4_ = (int)auVar28._4_4_;
          auVar26._8_4_ = (int)auVar28._8_4_;
          auVar26._12_4_ = (int)auVar28._12_4_;
          auVar26._16_4_ = (int)auVar28._16_4_;
          auVar26._20_4_ = (int)auVar28._20_4_;
          auVar26._24_4_ = (int)auVar28._24_4_;
          auVar26._28_4_ = (int)auVar28._28_4_;
          auVar25 = vpslld_avx2(auVar26,0x17);
          auVar25 = vpaddd_avx2(auVar46,auVar25);
          auVar25 = vfmsub213ps_avx512vl(auVar25,auVar24,auVar58);
          auVar12 = vfmadd213ps_fma(auVar25,auVar22,auVar23);
          *(undefined1 (*) [32])*pauVar10 = ZEXT1632(auVar12);
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x20);
          uVar7 = uVar6 + 8;
          iVar5 = uVar6 + 0xf;
          uVar6 = uVar7;
        } while (iVar5 < (int)uVar9);
      }
      if ((int)(uVar7 | 3) < (int)uVar9) {
        fVar1 = (this->super_ELU).alpha;
        auVar37._4_4_ = fVar1;
        auVar37._0_4_ = fVar1;
        auVar37._8_4_ = fVar1;
        auVar37._12_4_ = fVar1;
        auVar41._8_4_ = 0x42b0c0a5;
        auVar41._0_8_ = 0x42b0c0a542b0c0a5;
        auVar41._12_4_ = 0x42b0c0a5;
        auVar43._8_4_ = 0xc2b0c0a5;
        auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar43._12_4_ = 0xc2b0c0a5;
        auVar45._8_4_ = 0x3f000000;
        auVar45._0_8_ = 0x3f0000003f000000;
        auVar45._12_4_ = 0x3f000000;
        auVar47._8_4_ = 0x3fb8aa3b;
        auVar47._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar47._12_4_ = 0x3fb8aa3b;
        auVar48._8_4_ = 0x3f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._12_4_ = 0x3f800000;
        auVar50._8_4_ = 0x3f318000;
        auVar50._0_8_ = 0x3f3180003f318000;
        auVar50._12_4_ = 0x3f318000;
        auVar51._8_4_ = 0x395e8083;
        auVar51._0_8_ = 0x395e8083395e8083;
        auVar51._12_4_ = 0x395e8083;
        auVar12 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar13 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar52._8_4_ = 0x3c088908;
        auVar52._0_8_ = 0x3c0889083c088908;
        auVar52._12_4_ = 0x3c088908;
        auVar14 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar15 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar16 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar16);
        auVar17 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar6 = uVar7;
        do {
          auVar18 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar10,auVar16);
          auVar19 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar10,auVar16);
          auVar19 = vminps_avx(auVar19,auVar41);
          auVar38 = vmaxps_avx(auVar43,auVar19);
          auVar20 = vfmadd231ps_fma(auVar45,auVar38,auVar47);
          auVar39._0_4_ = (int)auVar20._0_4_;
          auVar39._4_4_ = (int)auVar20._4_4_;
          auVar39._8_4_ = (int)auVar20._8_4_;
          auVar39._12_4_ = (int)auVar20._12_4_;
          auVar19 = vcvtdq2ps_avx(auVar39);
          uVar4 = vcmpps_avx512vl(auVar20,auVar19,1);
          auVar20 = vsubps_avx512vl(auVar19,auVar48);
          bVar3 = (bool)((byte)uVar4 & 1);
          auVar21._0_4_ = (float)((uint)bVar3 * auVar20._0_4_ | (uint)!bVar3 * auVar19._0_4_);
          bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
          auVar21._4_4_ = (float)((uint)bVar3 * auVar20._4_4_ | (uint)!bVar3 * auVar19._4_4_);
          bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
          auVar21._8_4_ = (float)((uint)bVar3 * auVar20._8_4_ | (uint)!bVar3 * auVar19._8_4_);
          bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
          auVar21._12_4_ = (float)((uint)bVar3 * auVar20._12_4_ | (uint)!bVar3 * auVar19._12_4_);
          auVar19 = vfmsub231ps_fma(auVar38,auVar21,auVar50);
          auVar38 = vfmsub231ps_fma(auVar19,auVar21,auVar51);
          auVar20._0_4_ = auVar38._0_4_ * auVar38._0_4_;
          auVar20._4_4_ = auVar38._4_4_ * auVar38._4_4_;
          auVar20._8_4_ = auVar38._8_4_ * auVar38._8_4_;
          auVar20._12_4_ = auVar38._12_4_ * auVar38._12_4_;
          auVar19 = vfmadd213ps_avx512vl(auVar12,auVar38,auVar13);
          auVar19 = vfmadd213ps_fma(auVar19,auVar38,auVar52);
          auVar19 = vfmadd213ps_avx512vl(auVar19,auVar38,auVar14);
          auVar19 = vfmadd213ps_avx512vl(auVar19,auVar38,auVar15);
          auVar19 = vfmadd213ps_fma(auVar19,auVar38,auVar45);
          auVar19 = vfmadd213ps_fma(auVar19,auVar20,auVar38);
          auVar38._0_4_ = auVar19._0_4_ + 1.0;
          auVar38._4_4_ = auVar19._4_4_ + 1.0;
          auVar38._8_4_ = auVar19._8_4_ + 1.0;
          auVar38._12_4_ = auVar19._12_4_ + 1.0;
          auVar19._0_4_ = (int)auVar21._0_4_;
          auVar19._4_4_ = (int)auVar21._4_4_;
          auVar19._8_4_ = (int)auVar21._8_4_;
          auVar19._12_4_ = (int)auVar21._12_4_;
          auVar19 = vpslld_avx(auVar19,0x17);
          auVar19 = vpaddd_avx512vl(auVar19,auVar17);
          auVar19 = vfmsub213ps_fma(auVar19,auVar38,auVar48);
          auVar19 = vfmadd213ps_fma(auVar19,auVar37,auVar18);
          *(undefined1 (*) [16])*pauVar10 = auVar19;
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x10);
          uVar7 = uVar6 + 4;
          iVar5 = uVar6 + 7;
          uVar6 = uVar7;
        } while (iVar5 < (int)uVar9);
      }
      if (uVar9 - uVar7 != 0 && (int)uVar7 <= (int)uVar9) {
        lVar8 = 0;
        do {
          auVar12 = auVar53._0_16_;
          auVar13 = auVar54._0_16_;
          if (*(float *)(*pauVar10 + lVar8 * 4) < 0.0) {
            fVar1 = (this->super_ELU).alpha;
            auVar31._0_4_ = expf(*(float *)(*pauVar10 + lVar8 * 4));
            afVar49 = ::_ps512_cephes_exp_p5;
            afVar40 = ::_ps512_1;
            auVar31._4_60_ = extraout_var;
            auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar63 = ZEXT3264(auVar22);
            auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar62 = ZEXT3264(auVar22);
            auVar22 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar61 = ZEXT3264(auVar22);
            auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar60 = ZEXT3264(auVar22);
            auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar59 = ZEXT3264(auVar22);
            auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
            auVar57 = ZEXT3264(auVar22);
            auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar56 = ZEXT3264(auVar22);
            auVar22 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar55 = ZEXT3264(auVar22);
            auVar13 = vxorps_avx512vl(auVar13,auVar13);
            auVar54 = ZEXT1664(auVar13);
            auVar12 = vxorps_avx512vl(auVar12,auVar12);
            auVar53 = ZEXT1664(auVar12);
            auVar12 = ZEXT416((uint)fVar1);
            auVar12 = vfmsub213ss_fma(auVar31._0_16_,auVar12,auVar12);
            *(int *)(*pauVar10 + lVar8 * 4) = auVar12._0_4_;
          }
          lVar8 = lVar8 + 1;
        } while (uVar9 - uVar7 != (int)lVar8);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar2);
  }
  return 0;
}

Assistant:

int ELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}